

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase349::run(TestCase349 *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  SegmentBuilder *pSVar4;
  long *plVar5;
  AsyncIoStream *pAVar6;
  AsyncIoProvider *pAVar7;
  Which WVar8;
  MonotonicClock *clock;
  socklen_t __len;
  sockaddr *__addr;
  ReaderOptions receiveOptions;
  Builder body;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> msg;
  DebugComparison<capnp::rpc::Message::Which,_capnp::rpc::Message::Which> _kjCondition;
  PipeThread serverThread;
  AsyncIoContext ioContext;
  int handleCount;
  int callCount;
  Builder hostId;
  MallocMessageBuilder refMessage;
  TwoPartyVatNetwork network;
  undefined1 local_628 [32];
  anon_union_16_1_a8a2e026_for_OneOf<capnp::MessageStream_*,_kj::Own<capnp::MessageStream,_std::nullptr_t>_>_2
  local_608;
  StructBuilder local_5f8;
  Which local_5d0;
  undefined6 uStack_5ce;
  long *local_5c8;
  Which local_5ba;
  undefined8 local_5b8;
  CapTableReader *pCStack_5b0;
  WirePointer *local_5a8;
  bool local_5a0;
  SegmentBuilder *local_590;
  PipeThread local_588;
  Exception *local_568;
  CapTableReader *pCStack_560;
  void *local_558;
  WirePointer *pWStack_550;
  undefined8 *local_548;
  long *local_540;
  undefined8 *local_538;
  AsyncIoProvider *local_530;
  int local_518 [2];
  char *local_510;
  ArrayDisposer *pAStack_508;
  uint64_t local_500;
  char *local_4f8;
  undefined *puStack_4f0;
  Canceler local_4e8;
  StructBuilder local_4b0;
  MallocMessageBuilder local_488;
  TwoPartyVatNetwork local_398;
  
  kj::setupAsyncIo();
  local_518[1] = 0;
  local_518[0] = 0;
  runServer(&local_588,local_530,local_518 + 1,local_518);
  pAVar6 = local_588.pipe.ptr;
  clock = kj::systemCoarseMonotonicClock();
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  __len = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&local_398,pAVar6,CLIENT,receiveOptions,clock);
  MallocMessageBuilder::MallocMessageBuilder(&local_488,0x80,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_5f8,&local_488.super_MessageBuilder);
  local_628._16_8_ = local_5f8.data;
  local_628._0_8_ = local_5f8.segment;
  local_628._8_8_ = local_5f8.capTable;
  PointerBuilder::initStruct(&local_4b0,(PointerBuilder *)local_628,(StructSize)0x1);
  *(undefined2 *)(_func_int ***)local_4b0.data = 0;
  StructBuilder::asReader(&local_4b0);
  TwoPartyVatNetwork::connect((TwoPartyVatNetwork *)local_628,(int)&local_398,__addr,__len);
  uVar2 = local_628._8_8_;
  if ((CapTableReader *)local_628._8_8_ == (CapTableReader *)0x0) {
    local_5f8.segment = (SegmentBuilder *)0x0;
    local_628._0_8_ = (_func_int **)0x0;
    local_628._8_8_ = (_func_int **)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_5f8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_5f8);
  }
  local_590 = (SegmentBuilder *)local_628._0_8_;
  (*(*(_func_int ***)local_628._8_8_)[5])(local_628._8_8_,0);
  (***(_func_int ***)uVar2)(&local_5d0,uVar2,0x80);
  (**(code **)*local_5c8)(&local_568);
  local_5a8 = (WirePointer *)local_558;
  local_5b8 = local_568;
  pCStack_5b0 = pCStack_560;
  PointerBuilder::initStruct(&local_5f8,(PointerBuilder *)&local_5b8,(StructSize)0x10001);
  *(short *)&((WireValue<uint32_t>_conflict *)local_5f8.data)->value = 3;
  local_5b8 = (Exception *)local_5f8.segment;
  pCStack_5b0 = &(local_5f8.capTable)->super_CapTableReader;
  local_5a8 = local_5f8.pointers;
  PointerBuilder::initStruct
            ((StructBuilder *)local_628,(PointerBuilder *)&local_5b8,(StructSize)0x10002);
  *(undefined4 *)local_628._16_8_ = 0x4d2;
  *(short *)(local_628._16_8_ + 6) = 2;
  (**(code **)(*local_5c8 + 0x10))();
  plVar5 = local_5c8;
  if (local_5c8 != (long *)0x0) {
    local_5c8 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT62(uStack_5ce,local_5d0))
              ((undefined8 *)CONCAT62(uStack_5ce,local_5d0),
               (long)plVar5 + *(long *)(*plVar5 + -0x10));
  }
  (*(*(_func_int ***)uVar2)[1])(&local_5f8,uVar2);
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_4f0 = &DAT_004d6248;
  local_4e8.list.ptr = (Maybe<kj::Canceler::AdapterBase_&>)(AdapterBase *)0x5c00000178;
  kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::wait
            ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)local_628,
             &local_5f8);
  pSVar4 = local_5f8.segment;
  uVar3 = local_628._8_8_;
  uVar1 = local_628._0_8_;
  local_628._8_8_ = (_func_int **)0x0;
  if (local_5f8.segment != (SegmentBuilder *)0x0) {
    local_5f8.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar4);
  }
  if ((CapTableBuilder *)uVar3 != (CapTableBuilder *)0x0) {
    (**(_func_int **)*(CapTableReader *)uVar3)(&local_568,uVar3);
    local_5f8.data = local_558;
    local_5f8.pointers = pWStack_550;
    local_5f8.segment = (SegmentBuilder *)local_568;
    local_5f8.capTable = (CapTableBuilder *)pCStack_560;
    PointerReader::getStruct((StructReader *)local_628,(PointerReader *)&local_5f8,(word *)0x0);
    if ((uint)local_608._0_4_ < 0x10) {
      WVar8 = UNIMPLEMENTED;
    }
    else {
      WVar8 = *(Which *)local_628._16_8_;
    }
    local_5b8._0_4_ = CONCAT22(WVar8,ABORT);
    pCStack_5b0 = (CapTableReader *)0x4d6514;
    local_5a8 = (WirePointer *)&DAT_00000005;
    local_5a0 = WVar8 == ABORT;
    if ((!local_5a0) && (kj::_::Debug::minSeverity < 3)) {
      local_5d0 = ABORT;
      (***(_func_int ***)uVar3)(&local_568,uVar3);
      local_5f8.data = local_558;
      local_5f8.pointers = pWStack_550;
      local_5f8.segment = (SegmentBuilder *)local_568;
      local_5f8.capTable = (CapTableBuilder *)pCStack_560;
      PointerReader::getStruct((StructReader *)local_628,(PointerReader *)&local_5f8,(word *)0x0);
      if ((uint)local_608._0_4_ < 0x10) {
        local_5ba = UNIMPLEMENTED;
      }
      else {
        local_5ba = *(Which *)local_628._16_8_;
      }
      kj::_::Debug::
      log<char_const(&)[91],kj::_::DebugComparison<capnp::rpc::Message::Which,capnp::rpc::Message::Which>&,capnp::rpc::Message::Which,capnp::rpc::Message::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x179,ERROR,
                 "\"failed: expected \" \"(rpc::Message::ABORT) == (reply->getBody().getAs<rpc::Message>().which())\", _kjCondition, rpc::Message::ABORT, reply->getBody().getAs<rpc::Message>().which()"
                 ,(char (*) [91])
                  "failed: expected (rpc::Message::ABORT) == (reply->getBody().getAs<rpc::Message>().which())"
                 ,(DebugComparison<capnp::rpc::Message::Which,_capnp::rpc::Message::Which> *)
                  &local_5b8,&local_5d0,&local_5ba);
    }
    (**(code **)*(_func_int **)uVar1)
              (uVar1,(_func_int *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    (*(*(_func_int ***)uVar2)[1])(&local_5b8,uVar2);
    local_510 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
    ;
    pAStack_508 = (ArrayDisposer *)&DAT_004d6248;
    local_500 = 0x530000017c;
    kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::wait
              ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
               &local_5f8,&local_5b8);
    pSVar4 = (SegmentBuilder *)local_5b8;
    local_608.space[8] = local_5f8.capTable == (CapTableBuilder *)0x0;
    local_628._0_8_ = local_5f8.segment;
    local_628._8_8_ = local_5f8.capTable;
    local_628._16_8_ = &kj::none;
    local_628._24_8_ = " == ";
    local_608._0_8_ = 5;
    local_5f8.capTable = (CapTableBuilder *)0x0;
    if (local_5b8 != (Exception *)0x0) {
      local_5b8 = (Exception *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar4);
    }
    if (((local_608.space[8] & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[86],kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x17c,ERROR,
                 "\"failed: expected \" \"conn->receiveIncomingMessage().wait(ioContext.waitScope) == kj::none\", _kjCondition"
                 ,(char (*) [86])
                  "failed: expected conn->receiveIncomingMessage().wait(ioContext.waitScope) == kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>,_const_kj::None_&>
                   *)local_628);
    }
    uVar1 = local_628._8_8_;
    if ((CapTableBuilder *)local_628._8_8_ != (CapTableBuilder *)0x0) {
      local_628._8_8_ = (_func_int **)0x0;
      (**(code **)*(_func_int **)local_628._0_8_)
                (local_628._0_8_,uVar1 + *(long *)((long)*(CapTableReader *)uVar1 + -0x10));
    }
    (*(code *)((local_590->super_SegmentReader).arena)->_vptr_Arena)
              (local_590,(_func_int *)(uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
    MallocMessageBuilder::~MallocMessageBuilder(&local_488);
    TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_398);
    pAVar6 = local_588.pipe.ptr;
    if (local_588.pipe.ptr != (AsyncIoStream *)0x0) {
      local_588.pipe.ptr = (AsyncIoStream *)0x0;
      (**(local_588.pipe.disposer)->_vptr_Disposer)
                (local_588.pipe.disposer,
                 (pAVar6->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                 (long)&(pAVar6->super_AsyncInputStream)._vptr_AsyncInputStream);
    }
    if (local_588.thread.ptr != (Thread *)0x0) {
      local_588.thread.ptr = (Thread *)0x0;
      (**(local_588.thread.disposer)->_vptr_Disposer)();
    }
    pAVar7 = local_530;
    if (local_530 != (AsyncIoProvider *)0x0) {
      local_530 = (AsyncIoProvider *)0x0;
      (**(code **)*local_538)
                (local_538,pAVar7->_vptr_AsyncIoProvider[-2] + (long)&pAVar7->_vptr_AsyncIoProvider)
      ;
    }
    plVar5 = local_540;
    if (local_540 != (long *)0x0) {
      local_540 = (long *)0x0;
      (**(code **)*local_548)(local_548,(long)plVar5 + *(long *)(*plVar5 + -0x10));
    }
    return;
  }
  local_5f8.segment = (SegmentBuilder *)0x0;
  local_628._0_8_ = (_func_int **)0x0;
  local_628._8_8_ = (_func_int **)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_5f8,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_5f8);
}

Assistant:

TEST(TwoPartyNetwork, Abort) {
  // Verify that aborts are received.

  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);

  MallocMessageBuilder refMessage(128);
  auto hostId = refMessage.initRoot<rpc::twoparty::VatId>();
  hostId.setSide(rpc::twoparty::Side::SERVER);

  auto conn = KJ_ASSERT_NONNULL(network.connect(hostId));
  conn->setIdle(false);

  {
    // Send an invalid message (Return to non-existent question).
    auto msg = conn->newOutgoingMessage(128);
    auto body = msg->getBody().initAs<rpc::Message>().initReturn();
    body.setAnswerId(1234);
    body.setCanceled();
    msg->send();
  }

  {
    auto reply = KJ_ASSERT_NONNULL(conn->receiveIncomingMessage().wait(ioContext.waitScope));
    EXPECT_EQ(rpc::Message::ABORT, reply->getBody().getAs<rpc::Message>().which());
  }

  EXPECT_TRUE(conn->receiveIncomingMessage().wait(ioContext.waitScope) == kj::none);
}